

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O3

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
::
~ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
          (ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
           *this)

{
  int *piVar1;
  
  (this->super_ContractTestOnClassWithInvariant).super_Test._vptr_Test =
       (_func_int **)&PTR__ContractTestOnClassWithInvariant_001501f8;
  if (((this->super_ContractTestOnClassWithInvariant).sut._contract_light_contractor._invariantStack
       == 0) &&
     (piVar1 = &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled,
     *piVar1 = *piVar1 + 1, (this->super_ContractTestOnClassWithInvariant).sut.y != 0)) {
    contract_light::v_100::contract_detail::handleFailedInvariant
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x22);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}